

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallclocktimer.cpp
# Opt level: O3

Real __thiscall soplex::WallclockTimer::stop(WallclockTimer *this)

{
  long lVar1;
  long lVar2;
  Real RVar3;
  timeval tp;
  timeval local_20;
  
  if ((this->super_Timer).status == RUNNING) {
    gettimeofday(&local_20,(__timezone_ptr_t)0x0);
    lVar1 = this->usec + local_20.tv_usec;
    if (lVar1 < 0xf4241) {
      lVar2 = local_20.tv_sec + this->sec;
      this->sec = lVar2;
    }
    else {
      lVar2 = local_20.tv_sec + this->sec + 1;
      this->sec = lVar2;
      lVar1 = lVar1 + -1000000;
    }
    this->usec = lVar1;
    (this->super_Timer).status = STOPPED;
    RVar3 = (double)lVar1 * 1e-06 + (double)lVar2;
    this->lasttime = RVar3;
  }
  else {
    RVar3 = this->lasttime;
  }
  return RVar3;
}

Assistant:

Real WallclockTimer::stop()
{
   // status remains unchanged if timer is not running
   if(status == RUNNING)
   {
#if !defined(_WIN32) && !defined(_WIN64)
      struct timeval tp; /*lint !e86*/
#endif

#if defined(_WIN32) || defined(_WIN64)
      // we need the blank specifier to distiguish this method from WallclockTimer::time
      sec += ::time(nullptr);
#else
      gettimeofday(&tp, nullptr);

      if(tp.tv_usec + usec > 1000000)   /*lint !e115 !e40*/
      {
         sec += (tp.tv_sec + 1); /*lint !e115 !e40*/
         usec -= (1000000 - tp.tv_usec); /*lint !e115 !e40*/
      }
      else
      {
         sec += tp.tv_sec; /*lint !e115 !e40*/
         usec += tp.tv_usec; /*lint !e115 !e40*/
      }

#endif
      status = STOPPED;
      lasttime = wall2sec(sec, usec);
   }

   return lasttime;
}